

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-utils.cc
# Opt level: O1

File __thiscall mp::NLUtils::openf(NLUtils *this,string *fname,int Close,char *mode)

{
  char cVar1;
  FILE *pFVar2;
  long lVar3;
  undefined4 in_register_00000014;
  char *pcVar4;
  char *in_R8;
  
  this->_vptr_NLUtils = (_func_int **)0x0;
  pcVar4 = *(char **)CONCAT44(in_register_00000014,Close);
  if ((int)mode == 0) {
    pFVar2 = fopen(pcVar4,in_R8);
    this->_vptr_NLUtils = (_func_int **)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      pcVar4 = "can\'t open %s";
      lVar3 = 0x20;
    }
    else {
      cVar1 = (**(code **)((fname->_M_dataplus)._M_p + 0x28))(fname);
      if (cVar1 == '\0') {
        return (File)(FILE *)this;
      }
      pcVar4 = "File %s\n";
      lVar3 = 0x18;
    }
    (**(code **)((fname->_M_dataplus)._M_p + lVar3))
              (fname,pcVar4,*(undefined8 *)CONCAT44(in_register_00000014,Close));
  }
  else {
    remove(pcVar4);
  }
  return (File)(FILE *)this;
}

Assistant:

File NLUtils::
openf(const std::string& fname, int Close, const char *mode)
{
  File f;
  if (Close) {
    std::remove(fname.c_str());
    return f;
  }
  f.Open(fname.c_str(), mode);
  if (!f) {
    log_warning("can't open %s", fname.c_str());
    return f;
  }
  if (if_show_filenames())
    log_message("File %s\n", fname.c_str());
  return f;
}